

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptRegExpConstructor.cpp
# Opt level: O0

BOOL __thiscall
Js::JavascriptRegExpConstructor::IsEnumerable
          (JavascriptRegExpConstructor *this,PropertyId propertyId)

{
  BOOL BVar1;
  PropertyId propertyId_local;
  JavascriptRegExpConstructor *this_local;
  
  if (propertyId != 0x1d0) {
    if (propertyId - 0x1d1U < 9) {
      return 1;
    }
    if (propertyId != 0x1da) {
      if (propertyId - 0x1dbU < 5) {
        return 1;
      }
      if (3 < propertyId - 0x1e3U) {
        BVar1 = JavascriptFunction::IsEnumerable((JavascriptFunction *)this,propertyId);
        return BVar1;
      }
    }
  }
  return 0;
}

Assistant:

BOOL JavascriptRegExpConstructor::IsEnumerable(PropertyId propertyId)
    {
        switch (propertyId)
        {
        case PropertyIds::input:
        case PropertyIds::$1:
        case PropertyIds::$2:
        case PropertyIds::$3:
        case PropertyIds::$4:
        case PropertyIds::$5:
        case PropertyIds::$6:
        case PropertyIds::$7:
        case PropertyIds::$8:
        case PropertyIds::$9:
        case PropertyIds::leftContext:
        case PropertyIds::rightContext:
        case PropertyIds::lastMatch:
        case PropertyIds::lastParen:
            return true;
        case PropertyIds::$_:
        case PropertyIds::$Ampersand:
        case PropertyIds::$Plus:
        case PropertyIds::$BackTick:
        case PropertyIds::$Tick:
        case PropertyIds::index:
            return false;
        default:
            return JavascriptFunction::IsEnumerable(propertyId);
        }
    }